

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_array
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  spirv_cross local_168 [36];
  ID local_144;
  spirv_cross local_140 [32];
  undefined1 local_120 [8];
  SPIRAccessChain subchain;
  undefined1 local_48 [8];
  string ident;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  get_unique_identifier_abi_cxx11_((CompilerHLSL *)local_48);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  VectorView<unsigned_int>::size(&(pSVar3->array).super_VectorView<unsigned_int>);
  CompilerGLSL::to_array_size_abi_cxx11_
            ((CompilerGLSL *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             (SPIRType *)this,(uint32_t)pSVar3);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [7])" = 0; ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [4])" < ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             (char (*) [3])0x4e3ed3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [4])0x4e03b1);
  ::std::__cxx11::string::~string
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18));
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::SPIRAccessChain((SPIRAccessChain *)local_120,chain);
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            (local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
             ,(char (*) [4])0x4f3a06,&chain->array_stride,(char (*) [4])0x4f3a30,
             &chain->dynamic_index);
  ::std::__cxx11::string::operator=((string *)&subchain.field_0x30,(string *)local_140);
  ::std::__cxx11::string::~string((string *)local_140);
  subchain.super_IVariant._vptr_IVariant._4_4_ = (pSVar3->parent_type).id;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
              (&local_144,
               (TypedID<(spirv_cross::Types)1> *)((long)&subchain.super_IVariant._vptr_IVariant + 4)
              );
    subchain.loaded_from.id =
         Compiler::get_decoration((Compiler *)this,local_144,DecorationArrayStride);
  }
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (local_168,lhs,(char (*) [2])0x4f1699,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [2])0x4e3676);
  read_access_chain(this,(string *)0x0,(string *)local_168,(SPIRAccessChain *)local_120);
  ::std::__cxx11::string::~string((string *)local_168);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::~SPIRAccessChain((SPIRAccessChain *)local_120);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_array(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;
	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);
	read_access_chain(nullptr, join(lhs, "[", ident, "]"), subchain);
	end_scope();
}